

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O3

unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>,_true>
 arrow_array_stream_wrapper::anon_unknown_0::FactoryGetNext
           (uintptr_t stream_factory_ptr,ArrowStreamParameters *parameters)

{
  __buckets_ptr pp_Var1;
  _func_int_ArrowArrayStream_ptr_ArrowArray_ptr *p_Var2;
  _func_void_ArrowArrayStream_ptr *p_Var3;
  undefined8 *puVar4;
  pointer pAVar5;
  pointer *__ptr;
  
  puVar4 = (undefined8 *)operator_new(0x38);
  *puVar4 = &PTR_GetNextChunk_0198d5e8;
  puVar4[4] = 0;
  *(undefined8 **)stream_factory_ptr = puVar4;
  pAVar5 = duckdb::
           unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>,_true>
           ::operator->((unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>,_true>
                         *)stream_factory_ptr);
  (pAVar5->arrow_array_stream).private_data =
       *(void **)&(parameters->projected_columns).projection_map._M_h._M_rehash_policy;
  pp_Var1 = (parameters->projected_columns).projection_map._M_h._M_buckets;
  p_Var2 = (_func_int_ArrowArrayStream_ptr_ArrowArray_ptr *)
           (parameters->projected_columns).projection_map._M_h._M_bucket_count;
  p_Var3 = (_func_void_ArrowArrayStream_ptr *)
           (parameters->projected_columns).projection_map._M_h._M_element_count;
  (pAVar5->arrow_array_stream).get_last_error =
       (_func_char_ptr_ArrowArrayStream_ptr *)
       (parameters->projected_columns).projection_map._M_h._M_before_begin._M_nxt;
  (pAVar5->arrow_array_stream).release = p_Var3;
  (pAVar5->arrow_array_stream).get_schema =
       (_func_int_ArrowArrayStream_ptr_ArrowSchema_ptr *)pp_Var1;
  (pAVar5->arrow_array_stream).get_next = p_Var2;
  pAVar5 = duckdb::
           unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>,_true>
           ::operator->((unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>,_true>
                         *)stream_factory_ptr);
  (pAVar5->arrow_array_stream).release = EmptyStreamRelease;
  return (unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
          )(unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
            )stream_factory_ptr;
}

Assistant:

duckdb::unique_ptr<duckdb::ArrowArrayStreamWrapper> FactoryGetNext(uintptr_t stream_factory_ptr,
                                                                   duckdb::ArrowStreamParameters &parameters) {
	auto stream = reinterpret_cast<ArrowArrayStream *>(stream_factory_ptr);
	auto ret = duckdb::make_uniq<duckdb::ArrowArrayStreamWrapper>();
	ret->arrow_array_stream = *stream;
	ret->arrow_array_stream.release = EmptyStreamRelease;
	return ret;
}